

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__sort_edges_quicksort(stbtt__edge *p,int n)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int in_ESI;
  undefined8 *in_RDI;
  int z;
  int j;
  int i;
  int m;
  int c;
  int c12;
  int c01;
  stbtt__edge t;
  int local_40;
  int local_38;
  int local_34;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 *local_8;
  
  local_8 = in_RDI;
  while (0xc < in_ESI) {
    iVar3 = in_ESI >> 1;
    bVar2 = *(float *)((long)local_8 + (long)iVar3 * 0x14 + 4) <
            *(float *)((long)local_8 + (long)(in_ESI + -1) * 0x14 + 4);
    if (*(float *)((long)local_8 + 4) < *(float *)((long)local_8 + (long)iVar3 * 0x14 + 4) != bVar2)
    {
      if (*(float *)((long)local_8 + 4) < *(float *)((long)local_8 + (long)(in_ESI + -1) * 0x14 + 4)
          == bVar2) {
        local_40 = 0;
      }
      else {
        local_40 = in_ESI + -1;
      }
      puVar4 = (undefined8 *)((long)local_8 + (long)local_40 * 0x14);
      uVar1 = *puVar4;
      uVar6 = puVar4[1];
      uVar7 = *(undefined4 *)(puVar4 + 2);
      puVar5 = (undefined8 *)((long)local_8 + (long)iVar3 * 0x14);
      puVar4 = (undefined8 *)((long)local_8 + (long)local_40 * 0x14);
      *puVar4 = *puVar5;
      puVar4[1] = puVar5[1];
      *(undefined4 *)(puVar4 + 2) = *(undefined4 *)(puVar5 + 2);
      puVar4 = (undefined8 *)((long)local_8 + (long)iVar3 * 0x14);
      *puVar4 = uVar1;
      puVar4[1] = uVar6;
      *(undefined4 *)(puVar4 + 2) = uVar7;
    }
    uVar1 = *local_8;
    uVar6 = local_8[1];
    uVar7 = *(undefined4 *)(local_8 + 2);
    puVar4 = (undefined8 *)((long)local_8 + (long)iVar3 * 0x14);
    *local_8 = *puVar4;
    local_8[1] = puVar4[1];
    *(undefined4 *)(local_8 + 2) = *(undefined4 *)(puVar4 + 2);
    puVar4 = (undefined8 *)((long)local_8 + (long)iVar3 * 0x14);
    *puVar4 = uVar1;
    puVar4[1] = uVar6;
    *(undefined4 *)(puVar4 + 2) = uVar7;
    local_34 = 1;
    local_38 = in_ESI;
    while( true ) {
      while (*(float *)((long)local_8 + (long)local_34 * 0x14 + 4) < *(float *)((long)local_8 + 4))
      {
        local_34 = local_34 + 1;
      }
      do {
        local_38 = local_38 + -1;
      } while (*(float *)((long)local_8 + 4) < *(float *)((long)local_8 + (long)local_38 * 0x14 + 4)
              );
      if (local_38 <= local_34) break;
      puVar4 = (undefined8 *)((long)local_8 + (long)local_34 * 0x14);
      uVar1 = *puVar4;
      uVar6 = puVar4[1];
      uVar7 = *(undefined4 *)(puVar4 + 2);
      puVar5 = (undefined8 *)((long)local_8 + (long)local_38 * 0x14);
      puVar4 = (undefined8 *)((long)local_8 + (long)local_34 * 0x14);
      *puVar4 = *puVar5;
      puVar4[1] = puVar5[1];
      *(undefined4 *)(puVar4 + 2) = *(undefined4 *)(puVar5 + 2);
      puVar4 = (undefined8 *)((long)local_8 + (long)local_38 * 0x14);
      *puVar4 = uVar1;
      puVar4[1] = uVar6;
      *(undefined4 *)(puVar4 + 2) = uVar7;
      local_34 = local_34 + 1;
    }
    iVar3 = (int)((ulong)uVar6 >> 0x20);
    if (local_38 < in_ESI - local_34) {
      stbtt__sort_edges_quicksort((stbtt__edge *)CONCAT44(in_ESI,uVar7),iVar3);
      local_8 = (undefined8 *)((long)local_8 + (long)local_34 * 0x14);
      in_ESI = in_ESI - local_34;
    }
    else {
      stbtt__sort_edges_quicksort((stbtt__edge *)CONCAT44(in_ESI,uVar7),iVar3);
      in_ESI = local_38;
    }
  }
  return;
}

Assistant:

static void stbtt__sort_edges_quicksort(stbtt__edge *p, int n)
{
   /* threshold for transitioning to insertion sort */
   while (n > 12) {
      stbtt__edge t;
      int c01,c12,c,m,i,j;

      /* compute median of three */
      m = n >> 1;
      c01 = STBTT__COMPARE(&p[0],&p[m]);
      c12 = STBTT__COMPARE(&p[m],&p[n-1]);
      /* if 0 >= mid >= end, or 0 < mid < end, then use mid */
      if (c01 != c12) {
         /* otherwise, we'll need to swap something else to middle */
         int z;
         c = STBTT__COMPARE(&p[0],&p[n-1]);
         /* 0>mid && mid<n:  0>n => n; 0<n => 0 */
         /* 0<mid && mid>n:  0>n => 0; 0<n => n */
         z = (c == c12) ? 0 : n-1;
         t = p[z];
         p[z] = p[m];
         p[m] = t;
      }
      /* now p[m] is the median-of-three */
      /* swap it to the beginning so it won't move around */
      t = p[0];
      p[0] = p[m];
      p[m] = t;

      /* partition loop */
      i=1;
      j=n-1;
      for(;;) {
         /* handling of equality is crucial here */
         /* for sentinels & efficiency with duplicates */
         for (;;++i) {
            if (!STBTT__COMPARE(&p[i], &p[0])) break;
         }
         for (;;--j) {
            if (!STBTT__COMPARE(&p[0], &p[j])) break;
         }
         /* make sure we haven't crossed */
         if (i >= j) break;
         t = p[i];
         p[i] = p[j];
         p[j] = t;

         ++i;
         --j;
      }
      /* recurse on smaller side, iterate on larger */
      if (j < (n-i)) {
         stbtt__sort_edges_quicksort(p,j);
         p = p+i;
         n = n-i;
      } else {
         stbtt__sort_edges_quicksort(p+i, n-i);
         n = j;
      }
   }
}